

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O1

SstStream SstReaderOpen(char *Name,SstParams Params,SMPI_Comm comm)

{
  pthread_mutex_t *__mutex;
  size_t __size;
  _SstParams *p_Var1;
  char *__ptr;
  CMConnection p_Var2;
  int iVar3;
  undefined4 uVar4;
  __pid_t _Var5;
  char *pcVar6;
  SstStream Stream;
  CP_Info p_Var7;
  attr_list p_Var8;
  char *pcVar9;
  CP_DP_Interface p_Var10;
  DP_RS_Stream pvVar11;
  void **__ptr_00;
  CP_PeerConnection *pCVar12;
  undefined8 uVar13;
  uint uVar14;
  SMPI_Comm in_RCX;
  int *piVar15;
  int iVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  _ReaderActivateMsg Msg;
  CMConnection rank0_to_rank0_conn;
  void *free_block;
  timeval Stop;
  void *WriterFileID;
  char NeededDataPlane [32];
  _WriterResponseMsg *response;
  void *data_block;
  timeval Start;
  void *dpInfo;
  char *local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  void *pvStack_e0;
  void *local_d8;
  int *local_d0;
  CMConnection local_c8;
  char *local_c0;
  timeval local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *local_90;
  char local_88 [40];
  char *local_60;
  long local_58;
  void *local_50;
  timeval local_48;
  void *local_38;
  
  pcVar6 = strdup(Name);
  local_c8 = (CMConnection)0x0;
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_88[0x14] = '\0';
  local_88[0x15] = '\0';
  local_88[0x16] = '\0';
  local_88[0x17] = '\0';
  local_88[0x18] = '\0';
  local_88[0x19] = '\0';
  local_88[0x1a] = '\0';
  local_88[0x1b] = '\0';
  local_88[0x1c] = '\0';
  local_88[0x1d] = '\0';
  local_88[0x1e] = '\0';
  local_88[0x1f] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  Stream = CP_newStream();
  Stream->Role = ReaderRole;
  Stream->mpiComm = comm;
  piVar18 = &Stream->Rank;
  SMPI_Comm_rank(comm,piVar18);
  SMPI_Comm_size(Stream->mpiComm,&Stream->CohortSize);
  CP_validateParams(Stream,Params,0);
  Stream->ConfigParams = Params;
  p_Var7 = CP_getCPInfo(Params->ControlModule);
  Stream->CPInfo = p_Var7;
  Stream->FinalTimestep = 0x7fffffffffffffff;
  Stream->LastDPNotifiedTimestep = -1;
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  p_Var8 = ContactWriter(Stream,pcVar6,Params,in_RCX,&local_c8,&local_90);
  p_Var2 = local_c8;
  if (p_Var8 == (attr_list)0x0) {
    SstStreamDestroy(Stream);
    free(Stream);
    local_c0 = pcVar6;
    goto LAB_0073a1ec;
  }
  local_d0 = piVar18;
  if (*piVar18 == 0) {
    local_b8.tv_usec = 0;
    local_b8.tv_sec = (__time_t)local_90;
    uVar4 = CMCondition_get(Stream->CPInfo->SharedCM->cm,local_c8);
    local_b8.tv_usec = CONCAT44(local_b8.tv_usec._4_4_,uVar4);
    CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,uVar4,local_88);
    iVar3 = CMwrite(p_Var2,Stream->CPInfo->SharedCM->DPQueryFormat,&local_b8);
    if (iVar3 != 1) {
      CP_verbose(Stream,CriticalVerbose,
                 "DPQuery message failed to send to writer in SstReaderOpen\n");
    }
    CP_verbose(Stream,PerRankVerbose,
               "Waiting for writer DPResponse message in SstReadOpen(\"%s\")\n",pcVar6,
               local_b8.tv_usec & 0xffffffff);
    iVar3 = CMCondition_wait(Stream->CPInfo->SharedCM->cm,local_b8.tv_usec & 0xffffffff);
    if (iVar3 == 0) {
      SstReaderOpen_cold_1();
      return (SstStream)0x0;
    }
    CP_verbose(Stream,PerRankVerbose,
               "finished wait writer DPresponse message in read_open, WRITER is using \"%s\" DataPlane\n"
              );
    SMPI_Bcast(local_88,0x20,SMPI_CHAR,0,Stream->mpiComm);
  }
  else {
    SMPI_Bcast(local_88,0x20,SMPI_CHAR,0,Stream->mpiComm);
  }
  p_Var1 = Stream->ConfigParams;
  __ptr = p_Var1->DataTransport;
  pcVar9 = strdup(local_88);
  p_Var1->DataTransport = pcVar9;
  p_Var10 = SelectDP(&Svcs,Stream,p_Var1,Stream->Rank);
  Stream->DP_Interface = p_Var10;
  if ((p_Var10 != (CP_DP_Interface)0x0) && (iVar3 = strcmp(p_Var10->DPName,local_88), iVar3 != 0)) {
    fprintf(_stderr,
            "The writer is using the %s DataPlane for SST data transport, but the reader has failed to load this transport.  Communication cannot occur.  See the SST DataTransport engine parameter to force a match."
            ,local_88);
    return (SstStream)0x0;
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  FinalizeCPInfo(Stream->CPInfo,Stream->DP_Interface);
  pvVar11 = (*Stream->DP_Interface->initReader)
                      (&Svcs,Stream,&local_38,Stream->ConfigParams,p_Var8,&Stream->Stats);
  Stream->DP_Stream = pvVar11;
  free_attr_list(p_Var8);
  local_f8 = CP_GetContactString(Stream,(attr_list)0x0);
  local_b8.tv_usec = (__suseconds_t)local_38;
  uStack_f0 = Stream;
  local_b8.tv_sec = (__time_t)&local_f8;
  __ptr_00 = CP_consolidateDataToRankZero
                       (Stream,&local_b8,Stream->CPInfo->PerRankReaderInfoFormat,&local_50);
  free(local_f8);
  p_Var2 = local_c8;
  if (Stream->Rank == 0) {
    uStack_f0 = (SstStream)0x0;
    local_d8 = (void *)0x0;
    local_e8 = 0;
    pvStack_e0 = (void *)0x0;
    local_b8.tv_usec = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    local_b8.tv_sec = 0xffffffff;
    local_f8 = local_90;
    uVar4 = CMCondition_get(Stream->CPInfo->SharedCM->cm,local_c8);
    iVar3 = Stream->CohortSize;
    uStack_f0 = (SstStream)CONCAT44(iVar3,uVar4);
    uVar14 = Stream->ConfigParams->SpeculativePreloadMode;
    if (uVar14 < 2) {
LAB_00739e4b:
      local_e8 = CONCAT44(local_e8._4_4_,uVar14);
    }
    else if (uVar14 == 2) {
      local_e8 = local_e8 & 0xffffffff00000000;
      uVar14 = (uint)(iVar3 <= Stream->ConfigParams->SpecAutoNodeThreshold);
      goto LAB_00739e4b;
    }
    __size = (long)iVar3 * 8;
    pvStack_e0 = malloc(__size);
    local_d8 = malloc(__size);
    if (0 < iVar3) {
      lVar17 = 0;
      do {
        *(undefined8 *)((long)pvStack_e0 + lVar17 * 8) = *__ptr_00[lVar17];
        *(undefined8 *)((long)local_d8 + lVar17 * 8) = *(undefined8 *)((long)__ptr_00[lVar17] + 8);
        lVar17 = lVar17 + 1;
      } while (iVar3 != lVar17);
    }
    free(__ptr_00);
    local_58 = 0;
    CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,(ulong)uStack_f0 & 0xffffffff);
    iVar3 = CMwrite(p_Var2,Stream->CPInfo->SharedCM->ReaderRegisterFormat,&local_f8);
    if (iVar3 != 1) {
      CP_verbose(Stream,CriticalVerbose,"Message failed to send to writer in SstReaderOpen\n");
    }
    free(pvStack_e0);
    free(local_d8);
    CP_verbose(Stream,PerRankVerbose,"Waiting for writer response message in SstReadOpen(\"%s\")\n",
               pcVar6);
    iVar3 = CMCondition_wait(Stream->CPInfo->SharedCM->cm);
    piVar18 = local_d0;
    if (iVar3 == 0) {
      SstReaderOpen_cold_2();
    }
    else {
      CP_verbose(Stream,PerRankVerbose,"finished wait writer response message in read_open\n");
      if (local_58 != 0) {
        local_b8.tv_sec = CONCAT44(local_b8.tv_sec._4_4_,*(undefined4 *)(local_58 + 4));
        local_b8.tv_usec = *(ulong *)(local_58 + 8);
        local_a8 = *(undefined8 *)(local_58 + 0x10);
        uStack_a0 = *(undefined8 *)(local_58 + 0x18);
        local_98 = *(undefined8 *)(local_58 + 0x20);
      }
      __ptr_00 = (void **)CP_distributeDataFromRankZero
                                    (Stream,&local_b8,Stream->CPInfo->CombinedWriterInfoFormat,
                                     &local_c0);
    }
    if (iVar3 == 0) {
      return (SstStream)0x0;
    }
  }
  else {
    __ptr_00 = (void **)CP_distributeDataFromRankZero
                                  (Stream,(void *)0x0,Stream->CPInfo->CombinedWriterInfoFormat,
                                   &local_c0);
    piVar18 = local_d0;
  }
  free(local_50);
  if (*(int *)__ptr_00 == -1) {
LAB_0073a1ec:
    free(local_c0);
    return (SstStream)0x0;
  }
  if (*piVar18 == 0) {
    CP_verbose(Stream,SummaryVerbose,"Opening Reader Stream.\nWriter stream params are:\n");
    CP_dumpParams(Stream,(_SstParams *)__ptr_00[1],0);
    CP_verbose(Stream,SummaryVerbose,"Reader stream params are:\n");
    CP_dumpParams(Stream,Stream->ConfigParams,1);
  }
  Stream->WriterCohortSize = *(int *)__ptr_00;
  p_Var1 = (_SstParams *)__ptr_00[1];
  Stream->WriterConfigParams = p_Var1;
  if ((p_Var1->MarshalMethod == 0) && (*piVar18 == 0)) {
    CP_verbose(Stream,SummaryVerbose,"Writer is doing FFS-based marshalling\n");
  }
  if ((Stream->WriterConfigParams->MarshalMethod == 1) && (*piVar18 == 0)) {
    CP_verbose(Stream,SummaryVerbose,"Writer is doing BP-based marshalling\n");
  }
  if ((Stream->WriterConfigParams->CPCommPattern == 0) && (*piVar18 == 0)) {
    CP_verbose(Stream,SummaryVerbose,
               "Writer is using Minimum Connection Communication pattern (min)\n");
  }
  local_60 = pcVar6;
  if ((Stream->WriterConfigParams->CPCommPattern == 1) && (*piVar18 == 0)) {
    CP_verbose(Stream,SummaryVerbose,"Writer is using Peer-based Communication pattern (peer)\n");
  }
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  Stream->ReaderTimestep = (long)__ptr_00[2] + -1;
  if (Stream->WriterConfigParams->CPCommPattern == 1) {
    getPeerArrays(Stream->CohortSize,Stream->Rank,Stream->WriterCohortSize,&Stream->Peers,
                  (int **)0x0);
    do {
      if (Stream->ConnectionsToWriter == (CP_PeerConnection *)0x0) {
        _Var5 = getpid();
        pthread_self();
        piVar18 = local_d0;
        CP_verbose(Stream,PerRankVerbose,"(PID %lx, TID %lx) Waiting for first Peer notification\n",
                   (long)_Var5);
      }
      else {
        piVar15 = Stream->Peers;
        iVar3 = *piVar15;
        if (iVar3 == -1) {
          iVar16 = 0;
        }
        else {
          iVar16 = 0;
          do {
            piVar15 = piVar15 + 1;
            iVar16 = iVar16 + (uint)(Stream->ConnectionsToWriter[iVar3].CMconn == (CMConnection)0x0)
            ;
            iVar3 = *piVar15;
          } while (iVar3 != -1);
        }
        if (iVar16 == 0) goto LAB_0073a219;
        CP_verbose(Stream,PerRankVerbose,"Rank %d waiting for %d forward peer connections\n",
                   (ulong)(uint)*piVar18);
      }
      pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)__mutex);
    } while( true );
  }
  if (Stream->ConnectionsToWriter == (CP_PeerConnection *)0x0) {
    pCVar12 = (CP_PeerConnection *)calloc(0x18,(long)*(int *)__ptr_00);
    Stream->ConnectionsToWriter = pCVar12;
  }
LAB_0073a22f:
  if (0 < *(int *)__ptr_00) {
    lVar17 = 1;
    lVar19 = 0;
    do {
      uVar13 = attr_list_from_string(**(undefined8 **)((long)__ptr_00[3] + lVar19 * 8));
      pCVar12 = Stream->ConnectionsToWriter;
      *(undefined8 *)((long)pCVar12 + lVar17 * 8 + -8) = uVar13;
      (&pCVar12->ContactList)[lVar17] =
           *(attr_list *)(*(long *)((long)__ptr_00[3] + lVar19 * 8) + 8);
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 3;
    } while (lVar19 < *(int *)__ptr_00);
  }
  if (Stream->WriterConfigParams->CPCommPattern == 1) {
    if (local_c8 != (CMConnection)0x0) {
      CMConnection_dereference();
    }
  }
  else if (local_c8 != (CMConnection)0x0) {
    Stream->ConnectionsToWriter->CMconn = local_c8;
    CMconn_register_close_handler(local_c8,ReaderConnCloseHandler,Stream);
  }
  Stream->Status = Established;
  gettimeofday(&local_b8,(__timezone_ptr_t)0x0);
  lVar19 = local_b8.tv_usec - local_48.tv_usec;
  lVar17 = lVar19 + 1000000;
  if (-1 < lVar19) {
    lVar17 = lVar19;
  }
  Stream->OpenTimeSecs =
       (double)(long)(local_b8.tv_sec + ((lVar19 >> 0x3f) - local_48.tv_sec)) +
       (double)lVar17 / 1000000.0;
  gettimeofday((timeval *)&Stream->ValidStartTime,(__timezone_ptr_t)0x0);
  pcVar6 = local_60;
  Stream->Filename = local_60;
  Stream->ParamsBlock = local_c0;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  AddToLastCallFreeList(Stream);
  (*Stream->DP_Interface->provideWriterDataToReader)
            (&Svcs,Stream->DP_Stream,*(int *)__ptr_00,Stream->ConnectionsToWriter,
             (void **)__ptr_00[4]);
  CP_verbose(Stream,PerRankVerbose,"Sending Reader Activate messages to writer\n");
  local_f8 = (char *)0x0;
  sendOneToEachWriterRank(Stream,Stream->CPInfo->SharedCM->ReaderActivateFormat,&local_f8,&local_f8)
  ;
  CP_verbose(Stream,PerStepVerbose,"Finish opening Stream \"%s\", starting with Step number %ld\n",
             pcVar6,__ptr_00[2]);
  return Stream;
LAB_0073a219:
  CP_verbose(Stream,PerRankVerbose,"Rank %d has all forward peer connections\n",
             (ulong)(uint)*piVar18);
  goto LAB_0073a22f;
}

Assistant:

SstStream SstReaderOpen(const char *Name, SstParams Params, SMPI_Comm comm)
{
    SstStream Stream;
    void *dpInfo;
    struct _CP_DP_PairInfo **pointers;
    void *data_block;
    void *free_block;
    writer_data_t ReturnData;
    struct _ReaderActivateMsg Msg;
    struct timeval Start, Stop, Diff;
    char *Filename = strdup(Name);
    CMConnection rank0_to_rank0_conn = NULL;
    void *WriterFileID;
    char NeededDataPlane[32] = {0}; // Don't name a data plane longer than 31 chars

    Stream = CP_newStream();
    Stream->Role = ReaderRole;
    Stream->mpiComm = comm;

    SMPI_Comm_rank(Stream->mpiComm, &Stream->Rank);
    SMPI_Comm_size(Stream->mpiComm, &Stream->CohortSize);

    CP_validateParams(Stream, Params, 0 /* reader */);
    Stream->ConfigParams = Params;

    Stream->CPInfo = CP_getCPInfo(Stream->ConfigParams->ControlModule);

    Stream->FinalTimestep = SSIZE_T_MAX; /* set this on close */
    Stream->LastDPNotifiedTimestep = -1;

    gettimeofday(&Start, NULL);

    attr_list WriterContactAttributes =
        ContactWriter(Stream, Filename, Params, comm, &rank0_to_rank0_conn, &WriterFileID);

    if (WriterContactAttributes == NULL)
    {
        SstStreamDestroy(Stream);
        free(Stream);
        free(Filename);
        return NULL;
    }

    if (Stream->Rank == 0)
    {
        struct _DPQueryMsg DPQuery;
        memset(&DPQuery, 0, sizeof(DPQuery));

        DPQuery.WriterFile = WriterFileID;
        DPQuery.WriterResponseCondition =
            CMCondition_get(Stream->CPInfo->SharedCM->cm, rank0_to_rank0_conn);

        CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm, DPQuery.WriterResponseCondition,
                                    &NeededDataPlane[0]);

        if (CMwrite(rank0_to_rank0_conn, Stream->CPInfo->SharedCM->DPQueryFormat, &DPQuery) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "DPQuery message failed to send to writer in SstReaderOpen\n");
        }

        /* wait for "go" from writer */
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for writer DPResponse message in SstReadOpen(\"%s\")\n", Filename,
                   DPQuery.WriterResponseCondition);
        int result =
            CMCondition_wait(Stream->CPInfo->SharedCM->cm, DPQuery.WriterResponseCondition);
        if (result == 0)
        {
            fprintf(stderr, "The writer exited before contact could be made, "
                            "SST Open failed.\n");
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose,
                   "finished wait writer DPresponse message in read_open, "
                   "WRITER is using \"%s\" DataPlane\n",
                   &NeededDataPlane[0]);

        // NeededDP should now contain the name of the dataplane the writer is
        // using
        SMPI_Bcast(&NeededDataPlane[0], sizeof(NeededDataPlane), SMPI_CHAR, 0, Stream->mpiComm);
    }
    else
    {
        SMPI_Bcast(&NeededDataPlane[0], sizeof(NeededDataPlane), SMPI_CHAR, 0, Stream->mpiComm);
    }
    {
        char *RequestedDP = Stream->ConfigParams->DataTransport;
        Stream->ConfigParams->DataTransport = strdup(&NeededDataPlane[0]);
        Stream->DP_Interface = SelectDP(&Svcs, Stream, Stream->ConfigParams, Stream->Rank);
        if (Stream->DP_Interface)
            if (strcmp(Stream->DP_Interface->DPName, &NeededDataPlane[0]) != 0)
            {
                fprintf(stderr,
                        "The writer is using the %s DataPlane for SST data "
                        "transport, but the reader has failed to load this "
                        "transport.  Communication cannot occur.  See the SST "
                        "DataTransport engine parameter to force a match.",
                        NeededDataPlane);
                return NULL;
            }
        if (RequestedDP)
            free(RequestedDP);
    }

    FinalizeCPInfo(Stream->CPInfo, Stream->DP_Interface);

    Stream->DP_Stream = Stream->DP_Interface->initReader(
        &Svcs, Stream, &dpInfo, Stream->ConfigParams, WriterContactAttributes, &Stream->Stats);

    free_attr_list(WriterContactAttributes);

    pointers =
        (struct _CP_DP_PairInfo **)ParticipateInReaderInitDataExchange(Stream, dpInfo, &data_block);

    if (Stream->Rank == 0)
    {
        struct _CombinedWriterInfo WriterData;
        struct _ReaderRegisterMsg ReaderRegister;

        memset(&ReaderRegister, 0, sizeof(ReaderRegister));
        memset(&WriterData, 0, sizeof(WriterData));
        WriterData.WriterCohortSize = -1;
        ReaderRegister.WriterFile = WriterFileID;
        ReaderRegister.WriterResponseCondition =
            CMCondition_get(Stream->CPInfo->SharedCM->cm, rank0_to_rank0_conn);
        ReaderRegister.ReaderCohortSize = Stream->CohortSize;
        switch (Stream->ConfigParams->SpeculativePreloadMode)
        {
        case SpecPreloadOff:
        case SpecPreloadOn:
            ReaderRegister.SpecPreload =
                (SpeculativePreloadMode)Stream->ConfigParams->SpeculativePreloadMode;
            break;
        case SpecPreloadAuto:
            ReaderRegister.SpecPreload = SpecPreloadOff;
            if (Stream->CohortSize <= Stream->ConfigParams->SpecAutoNodeThreshold)
            {
                ReaderRegister.SpecPreload = SpecPreloadOn;
            }
            break;
        }

        ReaderRegister.CP_ReaderInfo = malloc(ReaderRegister.ReaderCohortSize * sizeof(void *));
        ReaderRegister.DP_ReaderInfo = malloc(ReaderRegister.ReaderCohortSize * sizeof(void *));
        for (int i = 0; i < ReaderRegister.ReaderCohortSize; i++)
        {
            ReaderRegister.CP_ReaderInfo[i] = (CP_ReaderInitInfo)pointers[i]->CP_Info;
            ReaderRegister.DP_ReaderInfo[i] = pointers[i]->DP_Info;
        }
        free(pointers);

        /* the response value is set in the handler */
        volatile struct _WriterResponseMsg *response = NULL;
        CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,
                                    ReaderRegister.WriterResponseCondition, (void *)&response);

        if (CMwrite(rank0_to_rank0_conn, Stream->CPInfo->SharedCM->ReaderRegisterFormat,
                    &ReaderRegister) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "Message failed to send to writer in SstReaderOpen\n");
        }
        free(ReaderRegister.CP_ReaderInfo);
        free(ReaderRegister.DP_ReaderInfo);

        /* wait for "go" from writer */
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for writer response message in SstReadOpen(\"%s\")\n", Filename,
                   ReaderRegister.WriterResponseCondition);
        int result =
            CMCondition_wait(Stream->CPInfo->SharedCM->cm, ReaderRegister.WriterResponseCondition);
        if (result == 0)
        {
            fprintf(stderr, "The writer exited before the SST Reader Open "
                            "could be completed.\n");
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose, "finished wait writer response message in read_open\n");

        if (response)
        {
            WriterData.WriterCohortSize = response->WriterCohortSize;
            WriterData.WriterConfigParams = response->WriterConfigParams;
            WriterData.StartingStepNumber = response->NextStepNumber;
            WriterData.CP_WriterInfo = response->CP_WriterInfo;
            WriterData.DP_WriterInfo = response->DP_WriterInfo;
        }
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &WriterData, Stream->CPInfo->CombinedWriterInfoFormat, &free_block);
    }
    else
    {
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->CombinedWriterInfoFormat, &free_block);
    }

    free(data_block);

    if (ReturnData->WriterCohortSize == -1)
    {
        /* Rank 0 found no writer at that contact point, fail the stream */
        free(free_block);
        return NULL;
    }

    if (Stream->Rank == 0)
    {
        CP_verbose(Stream, SummaryVerbose, "Opening Reader Stream.\nWriter stream params are:\n");
        CP_dumpParams(Stream, ReturnData->WriterConfigParams, 0 /* writer side */);
        CP_verbose(Stream, SummaryVerbose, "Reader stream params are:\n");
        CP_dumpParams(Stream, Stream->ConfigParams, 1 /* reader side */);
    }

    //    printf("I am reader rank %d, my info on writers is:\n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Stream->CPInfo->combined_writer_Format),
    //                ReturnData, 1024000);
    //    printf("\n");

    Stream->WriterCohortSize = ReturnData->WriterCohortSize;
    Stream->WriterConfigParams = ReturnData->WriterConfigParams;
    if ((Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose, "Writer is doing FFS-based marshalling\n");
    }
    if ((Stream->WriterConfigParams->MarshalMethod == SstMarshalBP) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose, "Writer is doing BP-based marshalling\n");
    }
    if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose,
                   "Writer is using Minimum Connection Communication pattern (min)\n");
    }
    if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose,
                   "Writer is using Peer-based Communication pattern (peer)\n");
    }
    STREAM_MUTEX_LOCK(Stream);
    Stream->ReaderTimestep = ReturnData->StartingStepNumber - 1;

    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        /*
         *  Wait for connections and messages from writer side peers
         */
        getPeerArrays(Stream->CohortSize, Stream->Rank, Stream->WriterCohortSize, &Stream->Peers,
                      NULL);

        while (!HasAllPeers(Stream))
        {
            /* wait until we get the timestep metadata or something else changes
             */
            STREAM_CONDITION_WAIT(Stream);
        }
    }
    else
    {
        if (!Stream->ConnectionsToWriter)
        {
            Stream->ConnectionsToWriter =
                calloc(sizeof(CP_PeerConnection), ReturnData->WriterCohortSize);
        }
    }

    for (int i = 0; i < ReturnData->WriterCohortSize; i++)
    {
        attr_list attrs = attr_list_from_string(ReturnData->CP_WriterInfo[i]->ContactInfo);
        Stream->ConnectionsToWriter[i].ContactList = attrs;
        Stream->ConnectionsToWriter[i].RemoteStreamID = ReturnData->CP_WriterInfo[i]->WriterID;
    }

    // Deref the original connection to writer rank 0 (might still be open as a
    // peer)
    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        if (rank0_to_rank0_conn)
        {
            CMConnection_dereference(rank0_to_rank0_conn);
        }
    }
    else
    {
        /* only rely on the rank 0 to rank 0 that we already have (if we're rank
         * 0) */
        if (rank0_to_rank0_conn)
        {
            CMConnection conn = rank0_to_rank0_conn;
            Stream->ConnectionsToWriter[0].CMconn = conn;
            CMconn_register_close_handler(conn, ReaderConnCloseHandler, (void *)Stream);
        }
    }
    Stream->Status = Established;
    gettimeofday(&Stop, NULL);
    timersub(&Stop, &Start, &Diff);
    Stream->OpenTimeSecs = (double)Diff.tv_usec / 1e6 + Diff.tv_sec;
    gettimeofday(&Stream->ValidStartTime, NULL);
    Stream->Filename = Filename;
    Stream->ParamsBlock = free_block;
    STREAM_MUTEX_UNLOCK(Stream);
    AddToLastCallFreeList(Stream);
    Stream->DP_Interface->provideWriterDataToReader(
        &Svcs, Stream->DP_Stream, ReturnData->WriterCohortSize, Stream->ConnectionsToWriter,
        ReturnData->DP_WriterInfo);
    CP_verbose(Stream, PerRankVerbose, "Sending Reader Activate messages to writer\n");
    memset(&Msg, 0, sizeof(Msg));
    sendOneToEachWriterRank(Stream, Stream->CPInfo->SharedCM->ReaderActivateFormat, &Msg,
                            &Msg.WSR_Stream);
    CP_verbose(Stream, PerStepVerbose,
               "Finish opening Stream \"%s\", starting with Step number %ld\n", Filename,
               ReturnData->StartingStepNumber);

    return Stream;
}